

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O0

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x8e,"r == 0");
    abort();
  }
  connection_fail(on_connect_without_close);
  if (timer_close_cb_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x92,"timer_close_cb_calls == 1");
    abort();
  }
  if (timer_cb_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x93,"timer_cb_calls == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-connection-fail.c"
            ,0x95,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  connection_fail(on_connect_without_close);

  ASSERT(timer_close_cb_calls == 1);
  ASSERT(timer_cb_calls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}